

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O2

iterator_template<spvtools::opt::Instruction> __thiscall
spvtools::utils::IntrusiveList<spvtools::opt::Instruction>::
iterator_template<spvtools::opt::Instruction>::MoveBefore
          (iterator_template<spvtools::opt::Instruction> *this,
          IntrusiveList<spvtools::opt::Instruction> *list)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  long in_RDX;
  
  pIVar4 = *(Instruction **)(in_RDX + 0x10);
  if ((pIVar4 == (Instruction *)0x0) ||
     ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    pIVar4 = (Instruction *)list->_vptr_IntrusiveList;
  }
  else {
    p_Var1 = *(_func_int **)(in_RDX + 0x18);
    pp_Var2 = list->_vptr_IntrusiveList;
    pIVar3 = (Instruction *)pp_Var2[2];
    (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar4;
    (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar3;
    *(_func_int ***)(p_Var1 + 8) = pp_Var2;
    pp_Var2[2] = p_Var1;
    *(long *)(in_RDX + 0x10) = in_RDX + 8;
    *(long *)(in_RDX + 0x18) = in_RDX + 8;
  }
  this->node_ = pIVar4;
  return (iterator_template<spvtools::opt::Instruction>)(Instruction *)this;
}

Assistant:

iterator_template MoveBefore(IntrusiveList* list) {
      if (list->empty()) return *this;

      NodeType* first_node = list->sentinel_.next_node_;
      NodeType* last_node = list->sentinel_.previous_node_;

      this->node_->previous_node_->next_node_ = first_node;
      first_node->previous_node_ = this->node_->previous_node_;

      last_node->next_node_ = this->node_;
      this->node_->previous_node_ = last_node;

      list->sentinel_.next_node_ = &list->sentinel_;
      list->sentinel_.previous_node_ = &list->sentinel_;

      return iterator(first_node);
    }